

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::TransformTimes(FormattingScene *this,Float start,Float end,FileLoc loc)

{
  Float local_48;
  Float local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_48 = end;
  local_44 = start;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_40,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,float&,float&>
            ("%sTransformTimes %f %f\n",&local_40,&local_44,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::TransformTimes(Float start, Float end, FileLoc loc) {
    Printf("%sTransformTimes %f %f\n", indent(), start, end);
}